

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_ring(rf_vec2 center,float inner_radius,float outer_radius,int start_angle,int end_angle
                 ,int segments,rf_color color)

{
  _Bool _Var1;
  float fVar2;
  float fVar3;
  float fVar4;
  long local_48;
  rf_int i;
  float angle;
  float step_length;
  float th;
  float CIRCLE_ERROR_RATE;
  int tmp_1;
  float tmp;
  int segments_local;
  int end_angle_local;
  int start_angle_local;
  float outer_radius_local;
  float inner_radius_local;
  rf_color color_local;
  rf_vec2 center_local;
  
  if (start_angle != end_angle) {
    end_angle_local = (int)outer_radius;
    start_angle_local = (int)inner_radius;
    if ((outer_radius < inner_radius) &&
       (end_angle_local = (int)inner_radius, start_angle_local = (int)outer_radius,
       inner_radius <= 0.0)) {
      end_angle_local = 0x3dcccccd;
    }
    tmp = (float)end_angle;
    segments_local = start_angle;
    if (end_angle < start_angle) {
      tmp = (float)start_angle;
      segments_local = end_angle;
    }
    tmp_1 = segments;
    if (segments < 4) {
      fVar2 = powf(1.0 - 0.5 / (float)end_angle_local,2.0);
      fVar2 = acosf(fVar2 + fVar2 + -1.0);
      fVar2 = ceilf(6.2831855 / fVar2);
      tmp_1 = (int)(((float)((int)tmp - segments_local) * fVar2) / 360.0);
      if (tmp_1 < 1) {
        tmp_1 = 4;
      }
    }
    if (0.0 < (float)start_angle_local) {
      fVar2 = (float)((int)tmp - segments_local) / (float)tmp_1;
      i._0_4_ = (float)segments_local;
      _Var1 = rf_gfx_check_buffer_limit(tmp_1 * 6);
      if (_Var1) {
        rf_gfx_draw();
      }
      rf_gfx_begin(RF_TRIANGLES);
      for (local_48 = 0; local_48 < tmp_1; local_48 = local_48 + 1) {
        outer_radius_local._0_1_ = color.r;
        outer_radius_local._1_1_ = color.g;
        outer_radius_local._2_1_ = color.b;
        outer_radius_local._3_1_ = color.a;
        rf_gfx_color4ub(outer_radius_local._0_1_,outer_radius_local._1_1_,outer_radius_local._2_1_,
                        outer_radius_local._3_1_);
        inner_radius_local = center.x;
        fVar3 = sinf((float)i * 0.017453292);
        color_local = (rf_color)center.y;
        fVar4 = cosf((float)i * 0.017453292);
        rf_gfx_vertex2f(fVar3 * (float)start_angle_local + inner_radius_local,
                        fVar4 * (float)start_angle_local + (float)color_local);
        fVar3 = sinf((float)i * 0.017453292);
        fVar4 = cosf((float)i * 0.017453292);
        rf_gfx_vertex2f(fVar3 * (float)end_angle_local + inner_radius_local,
                        fVar4 * (float)end_angle_local + (float)color_local);
        fVar3 = sinf(((float)i + fVar2) * 0.017453292);
        fVar4 = cosf(((float)i + fVar2) * 0.017453292);
        rf_gfx_vertex2f(fVar3 * (float)start_angle_local + inner_radius_local,
                        fVar4 * (float)start_angle_local + (float)color_local);
        fVar3 = sinf(((float)i + fVar2) * 0.017453292);
        fVar4 = cosf(((float)i + fVar2) * 0.017453292);
        rf_gfx_vertex2f(fVar3 * (float)start_angle_local + inner_radius_local,
                        fVar4 * (float)start_angle_local + (float)color_local);
        fVar3 = sinf((float)i * 0.017453292);
        fVar4 = cosf((float)i * 0.017453292);
        rf_gfx_vertex2f(fVar3 * (float)end_angle_local + inner_radius_local,
                        fVar4 * (float)end_angle_local + (float)color_local);
        fVar3 = sinf(((float)i + fVar2) * 0.017453292);
        fVar4 = cosf(((float)i + fVar2) * 0.017453292);
        rf_gfx_vertex2f(fVar3 * (float)end_angle_local + inner_radius_local,
                        fVar4 * (float)end_angle_local + (float)color_local);
        i._0_4_ = fVar2 + (float)i;
      }
      rf_gfx_end();
    }
    else {
      rf_draw_circle_sector(center,(float)end_angle_local,segments_local,(int)tmp,tmp_1,color);
    }
  }
  return;
}

Assistant:

RF_API void rf_draw_ring(rf_vec2 center, float inner_radius, float outer_radius, int start_angle, int end_angle, int segments, rf_color color)
{
    if (start_angle == end_angle) return;

    // Function expects (outerRadius > innerRadius)
    if (outer_radius < inner_radius)
    {
        float tmp = outer_radius;
        outer_radius = inner_radius;
        inner_radius = tmp;

        if (outer_radius <= 0.0f) outer_radius = 0.1f;
    }

    // Function expects (endAngle > start_angle)
    if (end_angle < start_angle)
    {
        // Swap values
        int tmp = start_angle;
        start_angle = end_angle;
        end_angle = tmp;
    }

    if (segments < 4)
    {
        // Calculate how many segments we need to draw a smooth circle, taken from https://stackoverflow.com/a/2244088

        float CIRCLE_ERROR_RATE = 0.5f;

        // Calculate the maximum angle between segments based on the error rate.
        float th = acosf(2*powf(1 - CIRCLE_ERROR_RATE/outer_radius, 2) - 1);
        segments = (end_angle - start_angle) * ceilf(2 * RF_PI / th) / 360;

        if (segments <= 0) segments = 4;
    }

    // Not a ring
    if (inner_radius <= 0.0f)
    {
        rf_draw_circle_sector(center, outer_radius, start_angle, end_angle, segments, color);
        return;
    }

    float step_length = (float)(end_angle - start_angle)/(float)segments;
    float angle = start_angle;
    if (rf_gfx_check_buffer_limit(6*segments)) rf_gfx_draw();

    rf_gfx_begin(RF_TRIANGLES);
    for (rf_int i = 0; i < segments; i++)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);

        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*inner_radius, center.y + cosf(RF_DEG2RAD*angle)*inner_radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*outer_radius, center.y + cosf(RF_DEG2RAD*angle)*outer_radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*inner_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*inner_radius);

        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*inner_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*inner_radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*outer_radius, center.y + cosf(RF_DEG2RAD*angle)*outer_radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*outer_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*outer_radius);

        angle += step_length;
    }
    rf_gfx_end();

}